

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

SeatPromptResult *
verify_ssh_host_key(SeatPromptResult *__return_storage_ptr__,InteractionReadySeat iseat,Conf *conf,
                   char *host,int port,ssh_key *key,char *keytype,char *keystr,char *keydisp,
                   char **fingerprints,int ca_count,_func_void_void_ptr_SeatPromptResult *callback,
                   void *ctx)

{
  undefined1 auVar1 [16];
  int iVar2;
  FingerprintType FVar3;
  char *pcVar4;
  strbuf *buf_o;
  char *pcVar5;
  SeatDialogText *sdt;
  SeatDialogPromptDescriptions *pSVar6;
  ssh_keyalg *psVar7;
  char *local_a8;
  HelpCtx helpctx;
  FingerprintType fptype_default;
  SeatDialogPromptDescriptions *pds;
  SeatDialogText *text;
  int local_68;
  int storage_status;
  int i_1;
  int atoms;
  char *base64blob;
  strbuf *binblob;
  char *p;
  char *fingerprint;
  size_t i;
  ssh_key *key_local;
  int port_local;
  char *host_local;
  Conf *conf_local;
  InteractionReadySeat iseat_local;
  
  pcVar4 = conf_get_str_nthstrkey(conf,0xc3,0);
  if (pcVar4 == (char *)0x0) {
    iVar2 = check_stored_host_key(host,port,keytype,keystr);
    if (iVar2 == 0) {
      make_spr_simple(__return_storage_ptr__,SPRK_OK);
    }
    else {
      sdt = seat_dialog_text_new();
      pSVar6 = seat_prompt_descriptions(iseat.seat);
      FVar3 = ssh2_pick_default_fingerprint(fingerprints);
      seat_dialog_text_append(sdt,SDT_TITLE,"%s Security Alert","Uppity");
      if ((key == (ssh_key *)0x0) || (psVar7 = ssh_key_alg(key), (psVar7->is_certificate & 1U) == 0)
         ) {
        if (iVar2 == 1) {
          seat_dialog_text_append(sdt,SDT_PARA,"The host key is not cached for this server:");
          seat_dialog_text_append(sdt,SDT_DISPLAY,"%s (port %d)",host,(ulong)(uint)port);
          seat_dialog_text_append
                    (sdt,SDT_PARA,
                     "You have no guarantee that the server is the computer you think it is.");
          seat_dialog_text_append(sdt,SDT_PARA,"The server\'s %s key fingerprint is:",keytype);
          seat_dialog_text_append(sdt,SDT_DISPLAY,"%s",fingerprints[FVar3]);
        }
        else {
          seat_dialog_text_append(sdt,SDT_SCARY_HEADING,"WARNING - POTENTIAL SECURITY BREACH!");
          seat_dialog_text_append
                    (sdt,SDT_PARA,
                     "The host key does not match the one %s has cached for this server:","Uppity");
          seat_dialog_text_append(sdt,SDT_DISPLAY,"%s (port %d)",host,(ulong)(uint)port);
          seat_dialog_text_append
                    (sdt,SDT_PARA,
                     "This means that either the server administrator has changed the host key, or you have actually connected to another computer pretending to be the server."
                    );
          seat_dialog_text_append(sdt,SDT_PARA,"The new %s key fingerprint is:",keytype);
          seat_dialog_text_append(sdt,SDT_DISPLAY,"%s",fingerprints[FVar3]);
        }
      }
      else {
        seat_dialog_text_append(sdt,SDT_SCARY_HEADING,"WARNING - POTENTIAL SECURITY BREACH!");
        seat_dialog_text_append(sdt,SDT_PARA,"This server presented a certified host key:");
        seat_dialog_text_append(sdt,SDT_DISPLAY,"%s (port %d)",host,(ulong)(uint)port);
        if (ca_count == 0) {
          if (iVar2 != 2) {
            __assert_fail("storage_status == 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/common.c"
                          ,0x3c8,
                          "SeatPromptResult verify_ssh_host_key(InteractionReadySeat, Conf *, const char *, int, ssh_key *, const char *, char *, const char *, char **, int, void (*)(void *, SeatPromptResult), void *)"
                         );
          }
          seat_dialog_text_append
                    (sdt,SDT_PARA,
                     "which does not match the certified key %s had previously cached for this server."
                     ,"Uppity");
          seat_dialog_text_append
                    (sdt,SDT_PARA,
                     "This means that either the server administrator has changed the host key, or you have actually connected to another computer pretending to be the server."
                    );
        }
        else {
          pcVar4 = "one";
          if (1 < ca_count) {
            pcVar4 = "ones";
          }
          seat_dialog_text_append
                    (sdt,SDT_PARA,
                     "which was signed by a different certification authority from the %s %s is configured to trust for this server."
                     ,pcVar4,"Uppity");
          if (iVar2 == 2) {
            seat_dialog_text_append
                      (sdt,SDT_PARA,
                       "ALSO, that key does not match the key %s had previously cached for this server."
                       ,"Uppity");
            seat_dialog_text_append
                      (sdt,SDT_PARA,
                       "This means that either another certification authority is operating in this realm AND the server administrator has changed the host key, or you have actually connected to another computer pretending to be the server."
                      );
          }
          else {
            seat_dialog_text_append
                      (sdt,SDT_PARA,
                       "This means that either another certification authority is operating in this realm, or you have actually connected to another computer pretending to be the server."
                      );
          }
        }
        seat_dialog_text_append(sdt,SDT_PARA,"The new %s key fingerprint is:",keytype);
        seat_dialog_text_append(sdt,SDT_DISPLAY,"%s",fingerprints[FVar3]);
      }
      seat_dialog_text_append(sdt,SDT_BATCH_ABORT,"Connection abandoned.");
      if (iVar2 == 1) {
        seat_dialog_text_append
                  (sdt,SDT_PARA,
                   "If you trust this host, %s to add the key to %s\'s cache and carry on connecting."
                   ,pSVar6->hk_accept_action,"Uppity");
        seat_dialog_text_append
                  (sdt,SDT_PARA,
                   "If you want to carry on connecting just once, without adding the key to the cache, %s."
                   ,pSVar6->hk_connect_once_action);
        seat_dialog_text_append
                  (sdt,SDT_PARA,"If you do not trust this host, %s to abandon the connection.",
                   pSVar6->hk_cancel_action);
        seat_dialog_text_append(sdt,SDT_PROMPT,"Store key in cache?");
      }
      else {
        seat_dialog_text_append
                  (sdt,SDT_PARA,
                   "If you were expecting this change and trust the new key, %s to update %s\'s cache and carry on connecting."
                   ,pSVar6->hk_accept_action,"Uppity");
        seat_dialog_text_append
                  (sdt,SDT_PARA,
                   "If you want to carry on connecting but without updating the cache, %s.",
                   pSVar6->hk_connect_once_action);
        seat_dialog_text_append
                  (sdt,SDT_PARA,
                   "If you want to abandon the connection completely, %s to cancel. %s is the ONLY guaranteed safe choice."
                   ,pSVar6->hk_cancel_action,pSVar6->hk_cancel_action_Participle);
        seat_dialog_text_append(sdt,SDT_PROMPT,"Update cached key?");
      }
      seat_dialog_text_append(sdt,SDT_MORE_INFO_KEY,"Full text of host\'s public key");
      seat_dialog_text_append(sdt,SDT_MORE_INFO_VALUE_BLOB,"%s",keydisp);
      if (fingerprints[1] != (char *)0x0) {
        seat_dialog_text_append(sdt,SDT_MORE_INFO_KEY,"SHA256 fingerprint");
        seat_dialog_text_append(sdt,SDT_MORE_INFO_VALUE_SHORT,"%s",fingerprints[1]);
      }
      if (*fingerprints != (char *)0x0) {
        seat_dialog_text_append(sdt,SDT_MORE_INFO_KEY,"MD5 fingerprint");
        seat_dialog_text_append(sdt,SDT_MORE_INFO_VALUE_SHORT,"%s",*fingerprints);
      }
      seat_confirm_ssh_host_key
                (__return_storage_ptr__,iseat,host,port,keytype,keystr,sdt,(HelpCtx)0x0,callback,ctx
                );
      seat_dialog_text_free(sdt);
    }
  }
  else {
    if (fingerprints != (char **)0x0) {
      for (fingerprint = (char *)0x0; fingerprint < (char *)0x2; fingerprint = fingerprint + 1) {
        local_a8 = fingerprints[(long)fingerprint];
        if (local_a8 != (char *)0x0) {
          pcVar4 = strrchr(local_a8,0x20);
          if (pcVar4 != (char *)0x0) {
            local_a8 = pcVar4 + 1;
          }
          pcVar4 = conf_get_str_str_opt(conf,0xc3,local_a8);
          if (pcVar4 != (char *)0x0) {
            make_spr_simple(__return_storage_ptr__,SPRK_OK);
            return __return_storage_ptr__;
          }
        }
      }
    }
    if (key != (ssh_key *)0x0) {
      buf_o = strbuf_new();
      ssh_key_public_blob(key,buf_o->binarysink_);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = buf_o->len + 2;
      iVar2 = SUB164(auVar1 / ZEXT816(3),0);
      pcVar4 = (char *)safemalloc((long)(iVar2 * 4 + 1),1,0);
      for (local_68 = 0; local_68 < iVar2; local_68 = local_68 + 1) {
        base64_encode_atom(buf_o->u + local_68 * 3,(int)buf_o->len + local_68 * -3,
                           pcVar4 + (local_68 << 2));
      }
      pcVar4[iVar2 << 2] = '\0';
      strbuf_free(buf_o);
      pcVar5 = conf_get_str_str_opt(conf,0xc3,pcVar4);
      if (pcVar5 != (char *)0x0) {
        safefree(pcVar4);
        make_spr_simple(__return_storage_ptr__,SPRK_OK);
        return __return_storage_ptr__;
      }
      safefree(pcVar4);
    }
    make_spr_sw_abort_static(__return_storage_ptr__,"Host key not in manually configured list");
  }
  return __return_storage_ptr__;
}

Assistant:

SeatPromptResult verify_ssh_host_key(
    InteractionReadySeat iseat, Conf *conf, const char *host, int port,
    ssh_key *key, const char *keytype, char *keystr, const char *keydisp,
    char **fingerprints, int ca_count,
    void (*callback)(void *ctx, SeatPromptResult result), void *ctx)
{
    /*
     * First, check if the Conf includes a manual specification of the
     * expected host key. If so, that completely supersedes everything
     * else, including the normal host key cache _and_ including
     * manual overrides: we return success or failure immediately,
     * entirely based on whether the key matches the Conf.
     */
    if (conf_get_str_nthstrkey(conf, CONF_ssh_manual_hostkeys, 0)) {
        if (fingerprints) {
            for (size_t i = 0; i < SSH_N_FPTYPES; i++) {
                /*
                 * Each fingerprint string we've been given will have
                 * things like 'ssh-rsa 2048' at the front of it. Strip
                 * those off and narrow down to just the hash at the end
                 * of the string.
                 */
                const char *fingerprint = fingerprints[i];
                if (!fingerprint)
                    continue;
                const char *p = strrchr(fingerprint, ' ');
                fingerprint = p ? p+1 : fingerprint;
                if (conf_get_str_str_opt(conf, CONF_ssh_manual_hostkeys,
                                         fingerprint))
                    return SPR_OK;
            }
        }

        if (key) {
            /*
             * Construct the base64-encoded public key blob and see if
             * that's listed.
             */
            strbuf *binblob;
            char *base64blob;
            int atoms, i;
            binblob = strbuf_new();
            ssh_key_public_blob(key, BinarySink_UPCAST(binblob));
            atoms = (binblob->len + 2) / 3;
            base64blob = snewn(atoms * 4 + 1, char);
            for (i = 0; i < atoms; i++)
                base64_encode_atom(binblob->u + 3*i,
                                   binblob->len - 3*i, base64blob + 4*i);
            base64blob[atoms * 4] = '\0';
            strbuf_free(binblob);
            if (conf_get_str_str_opt(conf, CONF_ssh_manual_hostkeys,
                                     base64blob)) {
                sfree(base64blob);
                return SPR_OK;
            }
            sfree(base64blob);
        }

        return SPR_SW_ABORT("Host key not in manually configured list");
    }

    /*
     * Next, check the host key cache.
     */
    int storage_status = check_stored_host_key(host, port, keytype, keystr);
    if (storage_status == 0) /* matching key was found in the cache */
        return SPR_OK;

    /*
     * The key is either missing from the cache, or does not match.
     * Either way, fall back to an interactive prompt from the Seat.
     */
    SeatDialogText *text = seat_dialog_text_new();
    const SeatDialogPromptDescriptions *pds =
        seat_prompt_descriptions(iseat.seat);

    FingerprintType fptype_default =
        ssh2_pick_default_fingerprint(fingerprints);

    seat_dialog_text_append(
        text, SDT_TITLE, "%s Security Alert", appname);

    if (key && ssh_key_alg(key)->is_certificate) {
        seat_dialog_text_append(
            text, SDT_SCARY_HEADING, "WARNING - POTENTIAL SECURITY BREACH!");
        seat_dialog_text_append(
            text, SDT_PARA, "This server presented a certified host key:");
        seat_dialog_text_append(
            text, SDT_DISPLAY, "%s (port %d)", host, port);
        if (ca_count) {
            seat_dialog_text_append(
                text, SDT_PARA, "which was signed by a different "
                "certification authority from the %s %s is configured to "
                "trust for this server.", ca_count > 1 ? "ones" : "one",
                appname);
            if (storage_status == 2) {
                seat_dialog_text_append(
                    text, SDT_PARA, "ALSO, that key does not match the key "
                    "%s had previously cached for this server.", appname);
                seat_dialog_text_append(
                    text, SDT_PARA, "This means that either another "
                    "certification authority is operating in this realm AND "
                    "the server administrator has changed the host key, or "
                    "you have actually connected to another computer "
                    "pretending to be the server.");
            } else {
                seat_dialog_text_append(
                    text, SDT_PARA, "This means that either another "
                    "certification authority is operating in this realm, or "
                    "you have actually connected to another computer "
                    "pretending to be the server.");
            }
        } else {
            assert(storage_status == 2);
            seat_dialog_text_append(
                text, SDT_PARA, "which does not match the certified key %s "
                "had previously cached for this server.", appname);
            seat_dialog_text_append(
                text, SDT_PARA, "This means that either the server "
                "administrator has changed the host key, or you have actually "
                "connected to another computer pretending to be the server.");
        }
        seat_dialog_text_append(
            text, SDT_PARA, "The new %s key fingerprint is:", keytype);
        seat_dialog_text_append(
            text, SDT_DISPLAY, "%s", fingerprints[fptype_default]);
    } else if (storage_status == 1) {
        seat_dialog_text_append(
            text, SDT_PARA, "The host key is not cached for this server:");
        seat_dialog_text_append(
            text, SDT_DISPLAY, "%s (port %d)", host, port);
        seat_dialog_text_append(
            text, SDT_PARA, "You have no guarantee that the server is the "
            "computer you think it is.");
        seat_dialog_text_append(
            text, SDT_PARA, "The server's %s key fingerprint is:", keytype);
        seat_dialog_text_append(
            text, SDT_DISPLAY, "%s", fingerprints[fptype_default]);
    } else {
        seat_dialog_text_append(
            text, SDT_SCARY_HEADING, "WARNING - POTENTIAL SECURITY BREACH!");
        seat_dialog_text_append(
            text, SDT_PARA, "The host key does not match the one %s has "
            "cached for this server:", appname);
        seat_dialog_text_append(
            text, SDT_DISPLAY, "%s (port %d)", host, port);
        seat_dialog_text_append(
            text, SDT_PARA, "This means that either the server administrator "
            "has changed the host key, or you have actually connected to "
            "another computer pretending to be the server.");
        seat_dialog_text_append(
            text, SDT_PARA, "The new %s key fingerprint is:", keytype);
        seat_dialog_text_append(
            text, SDT_DISPLAY, "%s", fingerprints[fptype_default]);
    }

    /* The above text is printed even in batch mode. Here's where we stop if
     * we can't present interactive prompts. */
    seat_dialog_text_append(
        text, SDT_BATCH_ABORT, "Connection abandoned.");

    HelpCtx helpctx;

    if (storage_status == 1) {
        seat_dialog_text_append(
            text, SDT_PARA, "If you trust this host, %s to add the key to "
            "%s's cache and carry on connecting.",
            pds->hk_accept_action, appname);
        seat_dialog_text_append(
            text, SDT_PARA, "If you want to carry on connecting just once, "
            "without adding the key to the cache, %s.",
            pds->hk_connect_once_action);
        seat_dialog_text_append(
            text, SDT_PARA, "If you do not trust this host, %s to abandon the "
            "connection.", pds->hk_cancel_action);
        seat_dialog_text_append(
            text, SDT_PROMPT, "Store key in cache?");
        helpctx = HELPCTX(errors_hostkey_absent);
    } else {
        seat_dialog_text_append(
            text, SDT_PARA, "If you were expecting this change and trust the "
            "new key, %s to update %s's cache and carry on connecting.",
             pds->hk_accept_action, appname);
        seat_dialog_text_append(
            text, SDT_PARA, "If you want to carry on connecting but without "
            "updating the cache, %s.", pds->hk_connect_once_action);
        seat_dialog_text_append(
            text, SDT_PARA, "If you want to abandon the connection "
            "completely, %s to cancel. %s is the ONLY guaranteed safe choice.",
            pds->hk_cancel_action, pds->hk_cancel_action_Participle);
        seat_dialog_text_append(
            text, SDT_PROMPT, "Update cached key?");
        helpctx = HELPCTX(errors_hostkey_changed);
    }

    seat_dialog_text_append(text, SDT_MORE_INFO_KEY,
                            "Full text of host's public key");
    seat_dialog_text_append(text, SDT_MORE_INFO_VALUE_BLOB, "%s", keydisp);

    if (fingerprints[SSH_FPTYPE_SHA256]) {
        seat_dialog_text_append(text, SDT_MORE_INFO_KEY, "SHA256 fingerprint");
        seat_dialog_text_append(text, SDT_MORE_INFO_VALUE_SHORT, "%s",
                                fingerprints[SSH_FPTYPE_SHA256]);
    }
    if (fingerprints[SSH_FPTYPE_MD5]) {
        seat_dialog_text_append(text, SDT_MORE_INFO_KEY, "MD5 fingerprint");
        seat_dialog_text_append(text, SDT_MORE_INFO_VALUE_SHORT, "%s",
                                fingerprints[SSH_FPTYPE_MD5]);
    }

    SeatPromptResult toret = seat_confirm_ssh_host_key(
        iseat, host, port, keytype, keystr, text, helpctx, callback, ctx);
    seat_dialog_text_free(text);
    return toret;
}